

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool __thiscall AActor::SetState(AActor *this,FState *newstate,bool nofunction)

{
  FPlayerSkin *pFVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined1 local_58 [8];
  FStateParamInfo stp;
  FState *returned_state;
  undefined1 local_38 [4];
  TFlags<ActorRenderFlag,_unsigned_int> local_34;
  TFlags<ActorRenderFlag,_unsigned_int> local_30;
  uint local_2c;
  uint local_28;
  int newsprite;
  int prevsprite;
  bool nofunction_local;
  FState *newstate_local;
  AActor *this_local;
  
  newsprite._3_1_ = nofunction;
  _prevsprite = newstate;
  newstate_local = (FState *)this;
  if (((debugfile != (FILE *)0x0) && (this->player != (player_t *)0x0)) &&
     ((this->player->cheats & 0x2000U) != 0)) {
    fprintf((FILE *)debugfile,"for pl %td: SetState while predicting!\n",
            (long)&this->player[-0x519b].ConversationNPC / 0x2a0);
  }
  do {
    if (_prevsprite == (FState *)0x0) {
      this->state = (FState *)0x0;
      (*(this->super_DThinker).super_DObject._vptr_DObject[4])();
      return false;
    }
    if (this->state == (FState *)0x0) {
      local_28 = 0xffffffff;
    }
    else {
      local_28 = (uint)this->state->sprite;
    }
    this->state = _prevsprite;
    iVar3 = GetTics(this,_prevsprite);
    this->tics = iVar3;
    operator~((EnumType)local_38);
    TFlags<ActorRenderFlag,_unsigned_int>::operator&(&local_34,&this->renderflags);
    uVar4 = FState::GetFullbright(_prevsprite);
    TFlags<ActorRenderFlag,_unsigned_int>::FromInt
              ((TFlags<ActorRenderFlag,_unsigned_int> *)((long)&returned_state + 4),uVar4);
    TFlags<ActorRenderFlag,_unsigned_int>::operator|(&local_30,&local_34);
    TFlags<ActorRenderFlag,_unsigned_int>::operator=(&this->renderflags,&local_30);
    local_2c = (uint)_prevsprite->sprite;
    if (local_2c != 1) {
      bVar2 = FState::GetSameFrame(_prevsprite);
      if (!bVar2) {
        iVar3 = FState::GetFrame(_prevsprite);
        this->frame = (BYTE)iVar3;
      }
      if (local_2c != 2) {
        TFlags<ActorFlag4,_unsigned_int>::operator&
                  ((TFlags<ActorFlag4,_unsigned_int> *)&returned_state,
                   (int)this + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
        uVar4 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&returned_state);
        pFVar1 = skins;
        bVar2 = false;
        if (uVar4 == 0) {
          bVar2 = local_2c == this->SpawnState->sprite;
        }
        if (bVar2) {
          if ((this->player == (player_t *)0x0) || (skins == (FPlayerSkin *)0x0)) {
            if (local_2c != local_28) {
              this->sprite = (WORD)local_2c;
            }
          }
          else {
            iVar3 = userinfo_t::GetSkin(&this->player->userinfo);
            this->sprite = (WORD)pFVar1[iVar3].sprite;
          }
        }
        else {
          this->sprite = (WORD)local_2c;
        }
      }
    }
    if ((newsprite._3_1_ & 1) == 0) {
      local_58 = (undefined1  [8])_prevsprite;
      stp.mCallingState._0_4_ = 0;
      stp.mCallingState._4_4_ = 1;
      bVar2 = FState::CallAction(_prevsprite,this,this,(FStateParamInfo *)local_58,
                                 (FState **)&stp.mStateType);
      if (!bVar2) goto LAB_0068cf62;
      if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        return false;
      }
      if (stp._8_8_ == 0) goto LAB_0068cf62;
      _prevsprite = (FState *)stp._8_8_;
      this->tics = 0;
    }
    else {
LAB_0068cf62:
      _prevsprite = FState::GetNextState(_prevsprite);
    }
    if (this->tics != 0) {
      if (Renderer != (FRenderer *)0x0) {
        (*Renderer->_vptr_FRenderer[8])(Renderer,this);
      }
      return true;
    }
  } while( true );
}

Assistant:

bool AActor::SetState (FState *newstate, bool nofunction)
{
	if (debugfile && player && (player->cheats & CF_PREDICTING))
		fprintf (debugfile, "for pl %td: SetState while predicting!\n", player-players);
	do
	{
		if (newstate == NULL)
		{
			state = NULL;
			Destroy ();
			return false;
		}
		int prevsprite, newsprite;

		if (state != NULL)
		{
			prevsprite = state->sprite;
		}
		else
		{
			prevsprite = -1;
		}
		state = newstate;
		tics = GetTics(newstate);
		renderflags = (renderflags & ~RF_FULLBRIGHT) | ActorRenderFlags::FromInt (newstate->GetFullbright());
		newsprite = newstate->sprite;
		if (newsprite != SPR_FIXED)
		{ // okay to change sprite and/or frame
			if (!newstate->GetSameFrame())
			{ // okay to change frame
				frame = newstate->GetFrame();
			}
			if (newsprite != SPR_NOCHANGE)
			{ // okay to change sprite
				if (!(flags4 & MF4_NOSKIN) && newsprite == SpawnState->sprite)
				{ // [RH] If the new sprite is the same as the original sprite, and
				// this actor is attached to a player, use the player's skin's
				// sprite. If a player is not attached, do not change the sprite
				// unless it is different from the previous state's sprite; a
				// player may have been attached, died, and respawned elsewhere,
				// and we do not want to lose the skin on the body. If it wasn't
				// for Dehacked, I would move sprite changing out of the states
				// altogether, since actors rarely change their sprites after
				// spawning.
					if (player != NULL && skins != NULL)
					{
						sprite = skins[player->userinfo.GetSkin()].sprite;
					}
					else if (newsprite != prevsprite)
					{
						sprite = newsprite;
					}
				}
				else
				{
					sprite = newsprite;
				}
			}
		}

		if (!nofunction)
		{
			FState *returned_state;
			FStateParamInfo stp = { newstate, STATE_Actor, PSP_WEAPON };
			if (newstate->CallAction(this, this, &stp, &returned_state))
			{
				// Check whether the called action function resulted in destroying the actor
				if (ObjectFlags & OF_EuthanizeMe)
				{
					return false;
				}
				if (returned_state != NULL)
				{ // The action was an A_Jump-style function that wants to change the next state.
					newstate = returned_state;
					tics = 0;		 // make sure we loop and set the new state properly
					continue;
				}
			}
		}
		newstate = newstate->GetNextState();
	} while (tics == 0);

	if (Renderer != NULL)
	{
		Renderer->StateChanged(this);
	}
	return true;
}